

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::clear_cache_hash_map(search_private *priv)

{
  _func_void_uchar_ptr_scored_action *in_stack_00000008;
  v_hashmap<unsigned_char_*,_Search::scored_action> *in_stack_00000010;
  
  v_hashmap<unsigned_char_*,_Search::scored_action>::iter(in_stack_00000010,in_stack_00000008);
  v_hashmap<unsigned_char_*,_Search::scored_action>::clear
            ((v_hashmap<unsigned_char_*,_Search::scored_action> *)priv);
  return;
}

Assistant:

void clear_cache_hash_map(search_private& priv)
{
  priv.cache_hash_map.iter(free_key);
  priv.cache_hash_map.clear();
}